

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectDeclaration_Parameter.h
# Opt level: O3

void __thiscall
psy::C::ParameterDeclarationSymbol::~ParameterDeclarationSymbol(ParameterDeclarationSymbol *this)

{
  unique_ptr<psy::C::Symbol::SymbolImpl,_std::default_delete<psy::C::Symbol::SymbolImpl>_> *this_00;
  
  this_00 = &this[-1].super_ObjectDeclarationSymbol.super_DeclarationSymbol.super_Symbol.impl_;
  ObjectDeclarationSymbol::~ObjectDeclarationSymbol((ObjectDeclarationSymbol *)this_00);
  operator_delete(this_00,0x20);
  return;
}

Assistant:

class PSY_C_API ParameterDeclarationSymbol final : public ObjectDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a ParameterDeclarationSymbol.
     */
    virtual ParameterDeclarationSymbol* asParameterDeclaration() override { return this; }
    virtual const ParameterDeclarationSymbol* asParameterDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    ParameterDeclarationSymbol(const Symbol* containingSym,
              const SyntaxTree* tree,
              const Scope* enclosingScope);
}